

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool __thiscall nivalis::util::is_varname(util *this,string_view expr)

{
  bool bVar1;
  bool bVar2;
  size_t k;
  util *puVar3;
  
  bVar1 = is_varname_first(*(char *)expr._M_len);
  if (bVar1) {
    puVar3 = (util *)0x1;
    do {
      bVar1 = this <= puVar3;
      if (bVar1) {
        return bVar1;
      }
      bVar2 = is_identifier(((char *)expr._M_len)[(long)puVar3]);
      puVar3 = puVar3 + 1;
    } while (bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool is_varname(std::string_view expr) {
    if(!util::is_varname_first(expr[0])) return false;
    for (size_t k = 1; k < expr.size(); ++k) {
        if (!util::is_identifier(expr[k])) return false;
    }
    return true;
}